

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_read.cpp
# Opt level: O1

int write_to_data(void)

{
  ulong uVar1;
  uint len;
  ostream *poVar2;
  undefined4 *puVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  bVar6 = origin_bin[m_index] == 'L';
  if (bVar6) {
    uVar1 = 0;
    do {
      uVar4 = uVar1;
      if (uVar4 == 5) {
        bVar6 = true;
        break;
      }
      bVar6 = origin_bin[uVar4 + (long)m_index + 1] == anon_var_dwarf_120c8[uVar4 + 1];
      uVar1 = uVar4 + 1;
    } while (bVar6);
    bVar5 = 4 < uVar4;
  }
  else {
    bVar5 = false;
  }
  if ((bVar5) && (bVar6)) {
    m_index = 6;
    file_chara = origin_bin[6];
    if ((~origin_bin[6] & 0x7fU) == 0) {
      m_index = 7;
      bVar6 = origin_bin[7] == 'D';
      if (bVar6) {
        uVar1 = 0;
        do {
          uVar4 = uVar1;
          if (uVar4 == 4) {
            bVar6 = true;
            break;
          }
          bVar6 = origin_bin[uVar4 + 8] == "DATA:"[uVar4 + 1];
          uVar1 = uVar4 + 1;
        } while (bVar6);
        bVar5 = 3 < uVar4;
      }
      else {
        bVar5 = false;
      }
      if ((bVar5) && (bVar6)) {
        m_index = 0xc;
        len = find_str(origin_bin + 0xc,"CODE:",file_size + -0xc,5);
        if (len == 0) {
          d_adr = get_memory(4,0,new_mid);
          return 1;
        }
        if (len != 0xffffffff) {
          d_adr = get_memory(len,0,new_mid);
          if (d_adr != 0xffffffff) {
            memcpy(data_ptr + d_adr,origin_bin + m_index,(long)(int)len);
            m_index = m_index + len;
            return 1;
          }
          puVar3 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar3 = 0xe0;
          goto LAB_00105974;
        }
      }
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_120de);
  std::endl<char,std::char_traits<char>>(poVar2);
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0xf5;
LAB_00105974:
  __cxa_throw(puVar3,&int::typeinfo,0);
}

Assistant:

int write_to_data() {
	int data_len;
	if (!bincmp(origin_bin+m_index,LVM_SIGNE,BIN_HEAD_LEN))
	{
		std::cout << "不是这个虚拟机的可执行二进制文件" << std::endl;
		throw(LVM_BIN_READ_ERROR);
	}else m_index = BIN_HEAD_LEN;
	//判断是不是库文件
	file_chara = *(origin_bin + m_index);
	if (!(file_chara == 0x7f || file_chara == 0xff)) {
		std::cout << "不是这个虚拟机的可执行二进制文件" << std::endl;
		throw LVM_BIN_READ_ERROR;
	}
	++m_index;
	if (!bincmp(origin_bin+m_index,LVM_DATA,BIN_DATA_LEN))
	{
		std::cout << "不是这个虚拟机的可执行二进制文件" << std::endl;
		throw(LVM_BIN_READ_ERROR);
	}else m_index += BIN_DATA_LEN;
	data_len = find_str(origin_bin + m_index, LVM_CODE, file_size - m_index, BIN_CODE_LEN);
	if (data_len == -1){
		std::cout << "不是这个虚拟机的可执行二进制文件" << std::endl;
		throw(LVM_BIN_READ_ERROR);
	}else
	{
		if (data_len == 0) {
			d_adr = get_memory(4, DataSegType, new_mid);
			return LVM_SUCCESS;
		}
		d_adr=get_memory(data_len, DataSegType,new_mid);
		if(d_adr!=-1) memcpy(data_ptr+d_adr, origin_bin + m_index, data_len);
		else throw LVM_DATA_GET_ERROR;
	}
	m_index += data_len;
	return LVM_SUCCESS;
}